

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

Interval * __thiscall
vkt::shaderexecutor::FloatFunc2::applyMonotone
          (Interval *__return_storage_ptr__,FloatFunc2 *this,EvalContext *ctx,Interval *xi,
          Interval *yi)

{
  double dVar1;
  double dVar2;
  Interval *pIVar3;
  Interval **ppIVar4;
  undefined8 uVar5;
  double *pdVar6;
  undefined8 *puVar7;
  double *pdVar8;
  double dVar9;
  bool bVar10;
  deBool dVar11;
  undefined4 uVar12;
  float fVar13;
  Interval local_508;
  Interval local_4f0;
  Interval local_4d8;
  Interval local_4c0;
  Interval local_4a8;
  Interval *local_490;
  double local_488;
  double local_480;
  Interval local_478;
  double local_460;
  double local_458;
  double local_450;
  Interval local_448;
  Interval *local_430;
  Interval *pIStack_428;
  Interval *local_420;
  Interval **local_418;
  Interval *point_7;
  undefined8 uStack_408;
  undefined8 local_400;
  double *local_3f8;
  Interval *point_6;
  Interval point_hi__3;
  Interval point_lo__3;
  Interval *point_dst__3;
  undefined8 *puStack_3b0;
  ScopedRoundingMode point_ctx__3;
  Interval *ret_3;
  double y_3;
  double local_398;
  double local_390;
  Interval *local_388;
  Interval *pIStack_380;
  Interval *local_378;
  Interval **local_370;
  Interval *point_5;
  undefined8 uStack_360;
  undefined8 local_358;
  double *local_350;
  Interval *point_4;
  Interval point_hi__2;
  Interval point_lo__2;
  Interval *point_dst__2;
  double *pdStack_308;
  ScopedRoundingMode point_ctx__2;
  Interval *ret_2;
  double y_2;
  double local_2f0;
  double local_2e8;
  undefined1 local_2e0 [8];
  Interval ret_hi__1;
  Interval ret_lo__1;
  Interval *ret_dst__1;
  Interval *ret_arg__1;
  Interval *tmp2__1;
  double x_1;
  double local_278 [3];
  Interval local_260;
  Interval *local_248;
  Interval *pIStack_240;
  Interval *local_238;
  Interval **local_230;
  Interval *point_3;
  undefined8 uStack_220;
  undefined8 local_218;
  double *local_210;
  Interval *point_2;
  Interval point_hi__1;
  Interval point_lo__1;
  Interval *point_dst__1;
  undefined8 *puStack_1c8;
  ScopedRoundingMode point_ctx__1;
  Interval *ret_1;
  double y_1;
  double local_1b0;
  double local_1a8;
  Interval *local_1a0;
  Interval *pIStack_198;
  Interval *local_190;
  Interval **local_188;
  Interval *point_1;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 *local_168;
  Interval *point;
  Interval point_hi_;
  undefined1 auStack_138 [8];
  Interval point_lo_;
  Interval *point_dst_;
  double *pdStack_110;
  ScopedRoundingMode point_ctx_;
  Interval *ret;
  double y;
  undefined1 local_e8 [8];
  Interval ret_hi_;
  Interval ret_lo_;
  Interval *ret_dst_;
  Interval *ret_arg_;
  Interval *tmp2_;
  double x;
  double local_90;
  double local_88;
  double local_80;
  Interval tmp2__hi_;
  Interval tmp2__lo_;
  Interval *tmp2__dst_;
  Interval *tmp2__arg_;
  Interval reti;
  Interval *yi_local;
  Interval *xi_local;
  EvalContext *ctx_local;
  FloatFunc2 *this_local;
  
  reti.m_hi = (double)yi;
  tcu::Interval::Interval((Interval *)&tmp2__arg_);
  do {
    tcu::Interval::Interval((Interval *)&tmp2__hi_.m_hi);
    tcu::Interval::Interval((Interval *)&local_80);
    bVar10 = tcu::Interval::empty(xi);
    if (bVar10) {
      tcu::Interval::Interval((Interval *)&x);
      tmp2__arg_ = (Interval *)x;
      reti._0_8_ = local_90;
      reti.m_lo = local_88;
    }
    else {
      dVar1 = tcu::Interval::lo(xi);
      do {
        dVar9 = reti.m_hi;
        tcu::Interval::Interval((Interval *)&ret_hi_.m_hi);
        tcu::Interval::Interval((Interval *)local_e8);
        bVar10 = tcu::Interval::empty((Interval *)dVar9);
        if (bVar10) {
          tcu::Interval::Interval((Interval *)&y);
          tmp2__hi_.m_hi = y;
        }
        else {
          dVar2 = tcu::Interval::lo((Interval *)dVar9);
          pdStack_110 = &ret_hi_.m_hi;
          do {
            tcu::ScopedRoundingMode::ScopedRoundingMode
                      ((ScopedRoundingMode *)((long)&point_dst_ + 4));
            point_lo_.m_hi = (double)pdStack_110;
            tcu::Interval::Interval((Interval *)auStack_138);
            tcu::Interval::Interval((Interval *)&point);
            local_168 = (undefined8 *)auStack_138;
            deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
            uVar12 = SUB84(dVar1,0);
            (*(this->
              super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              ).
              super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              .super_FuncBase._vptr_FuncBase[0xc])(uVar12,dVar2,&point_1,this,ctx);
            puVar7 = local_168;
            local_168[2] = local_170;
            uVar5 = uStack_178;
            *puVar7 = point_1;
            puVar7[1] = uVar5;
            local_188 = &point;
            deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
            (*(this->
              super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              ).
              super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              .super_FuncBase._vptr_FuncBase[0xc])(uVar12,dVar2,&local_1a0,this,ctx);
            ppIVar4 = local_188;
            local_188[2] = local_190;
            pIVar3 = pIStack_198;
            *ppIVar4 = local_1a0;
            ppIVar4[1] = pIVar3;
            tcu::Interval::operator|((Interval *)&y_1,(Interval *)auStack_138,(Interval *)&point);
            *(double *)point_lo_.m_hi = y_1;
            *(double *)((long)point_lo_.m_hi + 8) = local_1b0;
            *(double *)((long)point_lo_.m_hi + 0x10) = local_1a8;
            tcu::ScopedRoundingMode::~ScopedRoundingMode
                      ((ScopedRoundingMode *)((long)&point_dst_ + 4));
            dVar11 = ::deGetFalse();
          } while (dVar11 != 0);
          dVar2 = tcu::Interval::hi((Interval *)dVar9);
          puStack_1c8 = (undefined8 *)local_e8;
          do {
            tcu::ScopedRoundingMode::ScopedRoundingMode
                      ((ScopedRoundingMode *)((long)&point_dst__1 + 4));
            puVar7 = puStack_1c8;
            tcu::Interval::Interval((Interval *)&point_hi__1.m_hi);
            tcu::Interval::Interval((Interval *)&point_2);
            local_210 = &point_hi__1.m_hi;
            deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
            (*(this->
              super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              ).
              super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              .super_FuncBase._vptr_FuncBase[0xc])(uVar12,dVar2,&point_3,this,ctx);
            pdVar6 = local_210;
            local_210[2] = (double)local_218;
            uVar5 = uStack_220;
            *pdVar6 = (double)point_3;
            pdVar6[1] = (double)uVar5;
            local_230 = &point_2;
            deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
            (*(this->
              super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              ).
              super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              .super_FuncBase._vptr_FuncBase[0xc])(uVar12,dVar2,&local_248,this,ctx);
            ppIVar4 = local_230;
            local_230[2] = local_238;
            pIVar3 = pIStack_240;
            *ppIVar4 = local_248;
            ppIVar4[1] = pIVar3;
            tcu::Interval::operator|(&local_260,(Interval *)&point_hi__1.m_hi,(Interval *)&point_2);
            *puVar7 = local_260._0_8_;
            puVar7[1] = local_260.m_lo;
            puVar7[2] = local_260.m_hi;
            tcu::ScopedRoundingMode::~ScopedRoundingMode
                      ((ScopedRoundingMode *)((long)&point_dst__1 + 4));
            dVar11 = ::deGetFalse();
          } while (dVar11 != 0);
          tcu::Interval::operator|
                    ((Interval *)local_278,(Interval *)&ret_hi_.m_hi,(Interval *)local_e8);
          tmp2__hi_.m_hi = local_278[0];
        }
        bVar10 = tcu::Interval::hasNaN((Interval *)dVar9);
        if (bVar10) {
          fVar13 = std::numeric_limits<float>::quiet_NaN();
          tcu::Interval::Interval((Interval *)&x_1,(double)fVar13);
          tcu::Interval::operator|=((Interval *)&tmp2__hi_.m_hi,(Interval *)&x_1);
        }
        dVar11 = ::deGetFalse();
      } while (dVar11 != 0);
      dVar1 = tcu::Interval::hi(xi);
      do {
        dVar9 = reti.m_hi;
        tcu::Interval::Interval((Interval *)&ret_hi__1.m_hi);
        tcu::Interval::Interval((Interval *)local_2e0);
        bVar10 = tcu::Interval::empty((Interval *)dVar9);
        if (bVar10) {
          tcu::Interval::Interval((Interval *)&y_2);
          local_80 = y_2;
          tmp2__hi_._0_8_ = local_2f0;
          tmp2__hi_.m_lo = local_2e8;
        }
        else {
          dVar2 = tcu::Interval::lo((Interval *)dVar9);
          pdStack_308 = &ret_hi__1.m_hi;
          do {
            tcu::ScopedRoundingMode::ScopedRoundingMode
                      ((ScopedRoundingMode *)((long)&point_dst__2 + 4));
            pdVar8 = pdStack_308;
            tcu::Interval::Interval((Interval *)&point_hi__2.m_hi);
            tcu::Interval::Interval((Interval *)&point_4);
            local_350 = &point_hi__2.m_hi;
            deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
            uVar12 = SUB84(dVar1,0);
            (*(this->
              super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              ).
              super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              .super_FuncBase._vptr_FuncBase[0xc])(uVar12,dVar2,&point_5,this,ctx);
            pdVar6 = local_350;
            local_350[2] = (double)local_358;
            uVar5 = uStack_360;
            *pdVar6 = (double)point_5;
            pdVar6[1] = (double)uVar5;
            local_370 = &point_4;
            deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
            (*(this->
              super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              ).
              super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              .super_FuncBase._vptr_FuncBase[0xc])(uVar12,dVar2,&local_388,this,ctx);
            ppIVar4 = local_370;
            local_370[2] = local_378;
            pIVar3 = pIStack_380;
            *ppIVar4 = local_388;
            ppIVar4[1] = pIVar3;
            tcu::Interval::operator|
                      ((Interval *)&y_3,(Interval *)&point_hi__2.m_hi,(Interval *)&point_4);
            *pdVar8 = y_3;
            pdVar8[1] = local_398;
            pdVar8[2] = local_390;
            tcu::ScopedRoundingMode::~ScopedRoundingMode
                      ((ScopedRoundingMode *)((long)&point_dst__2 + 4));
            dVar11 = ::deGetFalse();
          } while (dVar11 != 0);
          dVar2 = tcu::Interval::hi((Interval *)dVar9);
          puStack_3b0 = (undefined8 *)local_2e0;
          do {
            tcu::ScopedRoundingMode::ScopedRoundingMode
                      ((ScopedRoundingMode *)((long)&point_dst__3 + 4));
            puVar7 = puStack_3b0;
            tcu::Interval::Interval((Interval *)&point_hi__3.m_hi);
            tcu::Interval::Interval((Interval *)&point_6);
            local_3f8 = &point_hi__3.m_hi;
            deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
            (*(this->
              super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              ).
              super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              .super_FuncBase._vptr_FuncBase[0xc])(uVar12,dVar2,&point_7,this,ctx);
            pdVar6 = local_3f8;
            local_3f8[2] = (double)local_400;
            uVar5 = uStack_408;
            *pdVar6 = (double)point_7;
            pdVar6[1] = (double)uVar5;
            local_418 = &point_6;
            deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
            (*(this->
              super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              ).
              super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              .super_FuncBase._vptr_FuncBase[0xc])(uVar12,dVar2,&local_430,this,ctx);
            ppIVar4 = local_418;
            local_418[2] = local_420;
            pIVar3 = pIStack_428;
            *ppIVar4 = local_430;
            ppIVar4[1] = pIVar3;
            tcu::Interval::operator|(&local_448,(Interval *)&point_hi__3.m_hi,(Interval *)&point_6);
            *puVar7 = local_448._0_8_;
            puVar7[1] = local_448.m_lo;
            puVar7[2] = local_448.m_hi;
            tcu::ScopedRoundingMode::~ScopedRoundingMode
                      ((ScopedRoundingMode *)((long)&point_dst__3 + 4));
            dVar11 = ::deGetFalse();
          } while (dVar11 != 0);
          tcu::Interval::operator|
                    ((Interval *)&local_460,(Interval *)&ret_hi__1.m_hi,(Interval *)local_2e0);
          local_80 = local_460;
          tmp2__hi_._0_8_ = local_458;
          tmp2__hi_.m_lo = local_450;
        }
        bVar10 = tcu::Interval::hasNaN((Interval *)dVar9);
        if (bVar10) {
          fVar13 = std::numeric_limits<float>::quiet_NaN();
          tcu::Interval::Interval(&local_478,(double)fVar13);
          tcu::Interval::operator|=((Interval *)&local_80,&local_478);
        }
        dVar11 = ::deGetFalse();
      } while (dVar11 != 0);
      tcu::Interval::operator|
                ((Interval *)&local_490,(Interval *)&tmp2__hi_.m_hi,(Interval *)&local_80);
      tmp2__arg_ = local_490;
      reti._0_8_ = local_488;
      reti.m_lo = local_480;
    }
    bVar10 = tcu::Interval::hasNaN(xi);
    if (bVar10) {
      fVar13 = std::numeric_limits<float>::quiet_NaN();
      tcu::Interval::Interval(&local_4a8,(double)fVar13);
      tcu::Interval::operator|=((Interval *)&tmp2__arg_,&local_4a8);
    }
    dVar11 = ::deGetFalse();
  } while (dVar11 != 0);
  (*(this->
    super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    ).
    super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    .super_FuncBase._vptr_FuncBase[0xb])(&local_4c0,this,ctx,xi,reti.m_hi);
  tcu::Interval::operator|=((Interval *)&tmp2__arg_,&local_4c0);
  (*(this->
    super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    ).
    super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    .super_FuncBase._vptr_FuncBase[0xe])(&local_4f0);
  fVar13 = std::numeric_limits<float>::quiet_NaN();
  tcu::Interval::Interval(&local_508,(double)fVar13);
  tcu::Interval::operator|(&local_4d8,&local_4f0,&local_508);
  tcu::Interval::operator&=((Interval *)&tmp2__arg_,&local_4d8);
  tcu::FloatFormat::convert(__return_storage_ptr__,&ctx->format,(Interval *)&tmp2__arg_);
  return __return_storage_ptr__;
}

Assistant:

Interval			applyMonotone	(const EvalContext&	ctx,
										 const Interval&	xi,
										 const Interval&	yi) const
	{
		Interval reti;

		TCU_INTERVAL_APPLY_MONOTONE2(reti, x, xi, y, yi, ret,
									 TCU_SET_INTERVAL(ret, point,
													  point = this->applyPoint(ctx, x, y)));
		reti |= innerExtrema(ctx, xi, yi);
		reti &= (this->getCodomain() | TCU_NAN);

		return ctx.format.convert(reti);
	}